

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManPatSatImprove(Gia_Man_t *p,int nWords0,int fVerbose)

{
  int *piVar1;
  int iVar2;
  uint nCexes;
  Vec_Str_t *pVVar3;
  Gia_Man_t *pAig;
  Vec_Int_t *vCexStore;
  Vec_Wrd_t *pVVar4;
  long lVar5;
  int Counts [3];
  Vec_Str_t *vStatus;
  undefined8 local_50;
  int local_48;
  Vec_Wrd_t *local_40;
  Vec_Str_t *local_38;
  
  local_48 = 0;
  local_50 = 0;
  local_38 = (Vec_Str_t *)0x0;
  local_40 = Gia_ManSimPatSim(p);
  pAig = Gia_ManSimPatGenMiter(p,local_40);
  lVar5 = 0;
  vCexStore = Cbs2_ManSolveMiterNc(pAig,1000,&local_38,0);
  Gia_ManStop(pAig);
  pVVar3 = local_38;
  iVar2 = local_38->nSize;
  while( true ) {
    if (iVar2 <= lVar5) {
      nCexes = local_50._4_4_;
      if (fVerbose != 0) {
        printf("Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n",
               (ulong)(local_48 + local_50._4_4_ + (int)local_50),(ulong)local_50._4_4_);
      }
      if (nCexes == 0) {
        puts("There are no counter-examples.  No need for more simulation.");
      }
      else {
        pVVar4 = Gia_ManSimBitPacking(p,vCexStore,nCexes,(int)local_50);
        Vec_WrdFreeP(&p->vSimsPi);
        p->vSimsPi = pVVar4;
      }
      pVVar3 = local_38;
      free(local_38->pArray);
      free(pVVar3);
      Vec_IntFree(vCexStore);
      Vec_WrdFree(local_40);
      return;
    }
    if (2 < (byte)(pVVar3->pArray[lVar5] + 1U)) break;
    piVar1 = (int *)((long)&local_50 + (long)pVVar3->pArray[lVar5] * 4 + 4);
    *piVar1 = *piVar1 + 1;
    lVar5 = lVar5 + 1;
  }
  __assert_fail("Status >= -1 && Status <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x159,"void Gia_ManPatSatImprove(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManPatSatImprove( Gia_Man_t * p, int nWords0, int fVerbose )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    int i, Status, Counts[3] = {0};
    Gia_Man_t * pGia;
    Vec_Wrd_t * vSimsIn = NULL;
    Vec_Str_t * vStatus = NULL;
    Vec_Int_t * vCexStore = NULL;
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( p );
    //Gia_ManSimProfile( p );
    pGia  = Gia_ManSimPatGenMiter( p, vSims );
    vCexStore = Cbs2_ManSolveMiterNc( pGia, 1000, &vStatus, 0 );
    Gia_ManStop( pGia );
    Vec_StrForEachEntry( vStatus, Status, i )
    {
        assert( Status >= -1 && Status <= 1 );
        Counts[Status+1]++;
    }
    if ( fVerbose )
        printf( "Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n", Counts[1]+Counts[2]+Counts[0], Counts[1], Counts[2], Counts[0] );
    if ( Counts[1] == 0 )
        printf( "There are no counter-examples.  No need for more simulation.\n" );
    else
    {
        vSimsIn = Gia_ManSimBitPacking( p, vCexStore, Counts[1], Counts[0] );
        Vec_WrdFreeP( &p->vSimsPi );
        p->vSimsPi = vSimsIn;
        //Gia_ManSimProfile( p );
    }
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
    Vec_WrdFree( vSims );
}